

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O0

float __thiscall Imath_3_2::Frustum<float>::aspectExc(Frustum<float> *this)

{
  domain_error *this_00;
  long in_RDI;
  float a;
  float a_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float topMinusBottom;
  float rightMinusLeft;
  
  a = *(float *)(in_RDI + 0x14) - *(float *)(in_RDI + 0x10);
  a_00 = *(float *)(in_RDI + 0x18) - *(float *)(in_RDI + 0x1c);
  fVar1 = abs<float>(a_00);
  if (fVar1 < 1.0) {
    fVar1 = abs<float>(a);
    fVar2 = std::numeric_limits<float>::max();
    fVar3 = abs<float>(a_00);
    if (fVar2 * fVar3 < fVar1) {
      this_00 = (domain_error *)__cxa_allocate_exception(0x10);
      std::domain_error::domain_error
                (this_00,"Bad viewing frustum: aspect ratio cannot be computed.");
      __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
  }
  return a / a_00;
}

Assistant:

IMATH_CONSTEXPR14 inline T
Frustum<T>::aspectExc () const
{
    T rightMinusLeft = _right - _left;
    T topMinusBottom = _top - _bottom;

    if (abs (topMinusBottom) < T (1) &&
        abs (rightMinusLeft) >
            std::numeric_limits<T>::max () * abs (topMinusBottom))
    {
        throw std::domain_error ("Bad viewing frustum: "
                                 "aspect ratio cannot be computed.");
    }

    return rightMinusLeft / topMinusBottom;
}